

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

int lyht_insert_with_resize_cb
              (hash_table *ht,void *val_p,uint32_t hash,values_equal_cb resize_val_equal,
              void **match_p)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  ht_rec *first;
  void **local_40;
  ht_rec *local_38;
  ht_rec *rec;
  
  iVar1 = lyht_find_first(ht,hash,&local_38);
  if (iVar1 == 0) {
    if ((local_38->hash == hash) &&
       (iVar1 = (*ht->val_equal)(val_p,local_38->val,1,ht->cb_data), iVar1 != 0)) {
      if (match_p == (void **)0x0) {
        return 1;
      }
      *match_p = local_38->val;
      return 1;
    }
    first = local_38;
    if (1 < local_38->hits) {
      iVar1 = 1;
      do {
        iVar2 = lyht_find_collision(ht,&local_38,first);
        if (iVar2 != 0) {
          __assert_fail("!r",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                        ,0x272,
                        "int lyht_insert_with_resize_cb(struct hash_table *, void *, uint32_t, values_equal_cb, void **)"
                       );
        }
        if ((local_38->hash == hash) &&
           (iVar2 = (*ht->val_equal)(val_p,local_38->val,1,ht->cb_data), iVar2 != 0)) {
          if (match_p == (void **)0x0) {
            return 1;
          }
          *match_p = local_38->val;
          return 1;
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 < first->hits);
    }
    iVar1 = lyht_find_collision(ht,&local_38,first);
    local_40 = match_p;
    if (iVar1 == 0) {
      __assert_fail("r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                    ,0x27f,
                    "int lyht_insert_with_resize_cb(struct hash_table *, void *, uint32_t, values_equal_cb, void **)"
                   );
    }
  }
  else {
    first = (ht_rec *)0x0;
  }
  if (local_38->hits < 1) {
    local_38->hash = hash;
    local_38->hits = 1;
    memcpy(local_38->val,val_p,(ulong)ht->rec_size - 8);
    if (match_p != (void **)0x0) {
      *match_p = local_38->val;
    }
    if (first != (ht_rec *)0x0) {
      if (first->hits == 0x7fffffff) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
               ,0x28e);
      }
      first->hits = first->hits + 1;
    }
    uVar3 = ht->used + 1;
    ht->used = uVar3;
    if (ht->resize == 0) {
      iVar1 = 0;
    }
    else {
      uVar4 = (uVar3 * 100) / ht->size;
      iVar1 = 0;
      if (0x31 < (int)uVar4 && ht->resize == 1) {
        ht->resize = 2;
      }
      if (0x4a < (int)uVar4 && ht->resize == 2) {
        if (resize_val_equal != (values_equal_cb)0x0) {
          local_40 = (void **)ht->val_equal;
          ht->val_equal = resize_val_equal;
        }
        iVar1 = lyht_resize(ht,1);
        if (iVar1 == 0 && match_p != (void **)0x0) {
          lyht_find(ht,val_p,hash,match_p);
        }
        if (resize_val_equal != (values_equal_cb)0x0) {
          ht->val_equal = (values_equal_cb)local_40;
        }
      }
    }
    return iVar1;
  }
  __assert_fail("rec->hits < 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                ,0x283,
                "int lyht_insert_with_resize_cb(struct hash_table *, void *, uint32_t, values_equal_cb, void **)"
               );
}

Assistant:

int
lyht_insert_with_resize_cb(struct hash_table *ht, void *val_p, uint32_t hash,
                           values_equal_cb resize_val_equal, void **match_p)
{
    struct ht_rec *rec, *crec = NULL;
    int32_t i;
    int r, ret;
    values_equal_cb old_val_equal;

    if (!lyht_find_first(ht, hash, &rec)) {
        /* we found matching shortened hash */
        if ((rec->hash == hash) && ht->val_equal(val_p, &rec->val, 1, ht->cb_data)) {
            /* even the value matches */
            if (match_p) {
                *match_p = (void *)&rec->val;
            }
            return 1;
        }

        /* some collisions, we need to go through them, too */
        crec = rec;
        for (i = 1; i < crec->hits; ++i) {
            r = lyht_find_collision(ht, &rec, crec);
            assert(!r);

            /* compare values */
            if ((rec->hash == hash) && ht->val_equal(val_p, &rec->val, 1, ht->cb_data)) {
                if (match_p) {
                    *match_p = (void *)&rec->val;
                }
                return 1;
            }
        }

        /* value not found, get the record where it will be inserted */
        r = lyht_find_collision(ht, &rec, crec);
        assert(r);
    }

    /* insert it into the returned record */
    assert(rec->hits < 1);
    rec->hash = hash;
    rec->hits = 1;
    memcpy(&rec->val, val_p, ht->rec_size - (sizeof(struct ht_rec) - 1));
    if (match_p) {
        *match_p = (void *)&rec->val;
    }

    if (crec) {
        /* there was a collision, increase hits */
        if (crec->hits == INT32_MAX) {
            LOGINT(NULL);
        }
        ++crec->hits;
    }

    /* check size & enlarge if needed */
    ret = 0;
    ++ht->used;
    if (ht->resize) {
        r = (ht->used * 100) / ht->size;
        if ((ht->resize == 1) && (r >= LYHT_FIRST_SHRINK_PERCENTAGE)) {
            /* enable shrinking */
            ht->resize = 2;
        }
        if ((ht->resize == 2) && (r >= LYHT_ENLARGE_PERCENTAGE)) {
            if (resize_val_equal) {
                old_val_equal = lyht_set_cb(ht, resize_val_equal);
            }

            /* enlarge */
            ret = lyht_resize(ht, 1);
            /* if hash_table was resized, we need to find new matching value */
            if (ret == 0 && match_p) {
                lyht_find(ht, val_p, hash, match_p);
            }

            if (resize_val_equal) {
                lyht_set_cb(ht, old_val_equal);
            }
        }
    }
    return ret;
}